

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O2

token * collect_arg(dmr_C *C,token *prev,int vararg,position *pos,int count)

{
  uint uVar1;
  stream *psVar2;
  position pVar3;
  position pVar4;
  token *where;
  ulong uVar5;
  uint uVar6;
  token **C_00;
  bool bVar7;
  int local_34;
  
  uVar1 = *(uint *)&prev->pos;
  psVar2 = C->T->input_streams;
  local_34 = 0;
  where = prev;
LAB_0011e8a8:
  C_00 = &where->next;
  where = prev;
  do {
    where = scan_next((dmr_C *)C_00,(token **)where);
    if (where == &dmrC_eof_token_entry_) goto LAB_0011e9e8;
    pVar3 = where->pos;
    if ((((pVar3._0_4_ & 0x10003f) == 0x100011) && (-1 < (long)pVar3)) &&
       ((where->field_2).special == 0x23)) {
      dmrC_sparse_error(C,pVar3,"directive in argument list");
      preprocessor_line(C,psVar2 + (uVar1 >> 6 & 0x3fff),C_00);
    }
    else {
      uVar6 = pVar3._0_4_ & 0x3f;
      if (uVar6 - 0xf < 2) {
        if (1 < count) {
          *(where->field_2).string = (string)((uint)*(where->field_2).string | 0x80000000);
        }
      }
      else if (uVar6 - 0x12 < 2) goto LAB_0011e9e8;
      if (C->false_nesting == 0) break;
      *C_00 = where->next;
    }
    dmrC_allocator_free(&C->token_allocator,where);
  } while( true );
  pVar3 = where->pos;
  if ((pVar3._0_4_ & 0x3f) == 0x11) {
    uVar6 = (where->field_2).special;
    if (uVar6 == 0x29) {
      bVar7 = local_34 == 0;
      local_34 = local_34 + -1;
      if (bVar7) {
LAB_0011e9e8:
        *C_00 = &dmrC_eof_token_entry_;
        return where;
      }
    }
    else if (uVar6 == 0x28) {
      local_34 = local_34 + 1;
    }
    else if ((uVar6 == 0x2c) && (local_34 == 0 && vararg == 0)) goto LAB_0011e9e8;
  }
  uVar5 = (ulong)(SUB84(*pos,0) & 0xfffc0);
  where->pos = (position)((ulong)pVar3 & 0xfffffffffff0003f | uVar5);
  pVar4 = *pos;
  prev = (token *)0x80000000ffffffff;
  where->pos = (position)
               ((ulong)pVar3 & 0x80000000fff0003f | uVar5 | (ulong)pVar4 & 0x7fffffff00000000);
  where->pos = (position)
               ((ulong)pVar3 & 0x800000000030003f | uVar5 | (ulong)pVar4 & 0x7fffffff00000000 |
               (ulong)(SUB84(*pos,0) & 0xffc00000));
  goto LAB_0011e8a8;
}

Assistant:

static struct token *collect_arg(struct dmr_C *C, struct token *prev, int vararg, struct position *pos, int count)
{
	struct stream *stream = C->T->input_streams + prev->pos.stream;
	struct token **p = &prev->next;
	struct token *next;
	int nesting = 0;

	while (!dmrC_eof_token(next = scan_next(C, p))) {
		if (next->pos.newline && dmrC_match_op(next, '#')) {
			if (!next->pos.noexpand) {
				dmrC_sparse_error(C, next->pos,
					     "directive in argument list");
				preprocessor_line(C, stream, p);
				dmrC_allocator_free(&C->token_allocator, next);	/* Free the '#' token */
				continue;
			}
		}
		switch (dmrC_token_type(next)) {
		case TOKEN_STREAMEND:
		case TOKEN_STREAMBEGIN:
			*p = &dmrC_eof_token_entry_;
			return next;
		case TOKEN_STRING:
		case TOKEN_WIDE_STRING:
			if (count > 1)
				next->string->immutable = 1;
			break;
		}
		if (C->false_nesting) {
			*p = next->next;
			dmrC_allocator_free(&C->token_allocator, next);
			continue;
		}
		if (dmrC_match_op(next, '(')) {
			nesting++;
		} else if (dmrC_match_op(next, ')')) {
			if (!nesting--)
				break;
		} else if (dmrC_match_op(next, ',') && !nesting && !vararg) {
			break;
		}
		next->pos.stream = pos->stream;
		next->pos.line = pos->line;
		next->pos.pos = pos->pos;
		p = &next->next;
	}
	*p = &dmrC_eof_token_entry_;
	return next;
}